

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest_SetStringLarge_Test::
~MicroStringPrevTest_SetStringLarge_Test(MicroStringPrevTest_SetStringLarge_Test *this)

{
  internal::anon_unknown_0::MicroStringPrevTest::~MicroStringPrevTest
            ((MicroStringPrevTest *)(this + -0x10));
  operator_delete((MicroStringPrevTest *)(this + -0x10),200);
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SetStringLarge) {
  std::string input(128, 'a');
  std::string copy = input;
  const char* copy_data = copy.data();
  const size_t used = arena_space_used();
  str_.Set(std::move(copy), arena());
  EXPECT_EQ(str_.Get(), input);

  // Verify that the string was moved.
  EXPECT_EQ(copy_data, str_.Get().data());

  // In 32-bit mode, we will use memory that is not rounded to the arena
  // alignment because sizeof(StringRep) might not be a multiple of 8. Avoid
  // using `ExpectMemoryUsed` because it expects it.
  if (prev_state() != kString && has_arena()) {
    EXPECT_EQ(ArenaAlignDefault::Ceil(kLargeRepSize + sizeof(std::string)),
              arena_space_used() - used);
  }
  EXPECT_EQ(kLargeRepSize + sizeof(std::string) + input.capacity() + /* \0 */ 1,
            str_.SpaceUsedExcludingSelfLong());
}